

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

String __thiscall
doctest::detail::stringifyBinaryExpr<unsigned_long_long,int>
          (detail *this,unsigned_long_long *lhs,char *op,int *rhs)

{
  String local_58 [3];
  String local_40;
  String local_38;
  String local_30;
  int *local_28;
  int *rhs_local;
  char *op_local;
  unsigned_long_long *lhs_local;
  
  local_28 = rhs;
  rhs_local = (int *)op;
  op_local = (char *)lhs;
  lhs_local = (unsigned_long_long *)this;
  toString((doctest *)&local_38,*lhs);
  String::String(&local_40,(char *)rhs_local);
  String::operator+(&local_30,&local_38);
  toString((doctest *)local_58,*local_28);
  String::operator+((String *)this,&local_30);
  String::~String(local_58);
  String::~String(&local_30);
  String::~String(&local_40);
  String::~String(&local_38);
  return (String)(char *)this;
}

Assistant:

String stringifyBinaryExpr(const DOCTEST_REF_WRAP(L) lhs, const char* op,
                               const DOCTEST_REF_WRAP(R) rhs) {
        return toString(lhs) + op + toString(rhs);
    }